

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O3

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  iVar4 = (r->high_low_container).size;
  if ((long)iVar4 == 0) {
LAB_0010a29c:
    uVar8 = iVar4 - 1;
  }
  else {
    puVar2 = (r->high_low_container).keys;
    uVar10 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar4 + -1] == uVar10) goto LAB_0010a29c;
    uVar5 = 0;
    if (iVar4 < 1) goto LAB_0010a39c;
    iVar4 = iVar4 + -1;
    do {
      uVar8 = iVar4 + uVar5 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar4 + uVar5 & 0xfffffffe));
      if (uVar1 < uVar10) {
        uVar5 = uVar8 + 1;
      }
      else {
        if (uVar1 <= uVar10) goto LAB_0010a2a6;
        iVar4 = uVar8 - 1;
      }
    } while ((int)uVar5 <= iVar4);
    uVar8 = ~uVar5;
  }
  if (-1 < (int)uVar8) {
LAB_0010a2a6:
    uVar9 = (r->high_low_container).typecodes[uVar8 & 0xffff];
    puVar6 = (uint *)(r->high_low_container).containers[uVar8 & 0xffff];
    if (uVar9 == '\x04') {
      uVar9 = (uint8_t)puVar6[2];
      puVar6 = *(uint **)puVar6;
    }
    lVar3 = *(long *)(puVar6 + 2);
    uVar10 = (ushort)val;
    if (uVar9 != '\x03') {
      if (uVar9 != '\x02') {
        return (*(ulong *)(lVar3 + (ulong)(val >> 3 & 0x1ff8)) >> ((ulong)val & 0x3f) & 1) != 0;
      }
      uVar8 = 0;
      uVar11 = *puVar6;
      do {
        iVar4 = uVar8 + 0x10;
        while( true ) {
          if ((int)uVar11 <= iVar4) {
            if ((int)uVar11 <= (int)uVar8) {
              return false;
            }
            uVar7 = (ulong)uVar8;
            goto LAB_0010a3ba;
          }
          uVar5 = (uVar11 - 1) + uVar8;
          uVar12 = uVar5 >> 1;
          uVar1 = *(ushort *)(lVar3 + (ulong)(uVar5 & 0xfffffffe));
          if (uVar10 <= uVar1) break;
          uVar8 = uVar12 + 1;
          iVar4 = uVar12 + 0x11;
        }
        uVar5 = 1;
        uVar11 = uVar12;
      } while (uVar10 < uVar1);
LAB_0010a39c:
      return SUB41(uVar5,0);
    }
    if (0 < (int)*puVar6) {
      iVar4 = *puVar6 - 1;
      uVar7 = 0;
      do {
        uVar8 = (uint)(iVar4 + (int)uVar7) >> 1;
        uVar1 = *(ushort *)(lVar3 + (ulong)uVar8 * 4);
        if (uVar1 < uVar10) {
          uVar7 = (ulong)(uVar8 + 1);
        }
        else {
          if (uVar1 <= uVar10) {
            return true;
          }
          iVar4 = uVar8 - 1;
        }
      } while ((int)uVar7 <= iVar4);
      if (((int)uVar7 != 0) &&
         (uVar5 = 1,
         (int)((val & 0xffff) - (uint)*(ushort *)(lVar3 + -4 + uVar7 * 4)) <=
         (int)(uint)*(ushort *)(lVar3 + -2 + uVar7 * 4))) goto LAB_0010a39c;
    }
  }
  return false;
  while (iVar4 = (int)uVar7, uVar7 = uVar7 + 1, uVar11 - 1 != iVar4) {
LAB_0010a3ba:
    uVar1 = *(ushort *)(lVar3 + uVar7 * 2);
    bVar13 = uVar1 == uVar10;
    uVar5 = (uint)bVar13;
    if ((bVar13) || (uVar10 <= uVar1 && !bVar13)) break;
  }
  goto LAB_0010a39c;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}